

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.h
# Opt level: O2

void __thiscall
slang::ast::SequenceWithMatchExpr::visitExprs<slang::ast::builtins::SequenceMethodExprVisitor&>
          (SequenceWithMatchExpr *this,SequenceMethodExprVisitor *visitor)

{
  pointer ppEVar1;
  size_type sVar2;
  long lVar3;
  
  AssertionExpr::visit<slang::ast::builtins::SequenceMethodExprVisitor>(this->expr,visitor);
  ppEVar1 = (this->matchItems).data_;
  sVar2 = (this->matchItems).size_;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    Expression::visit<slang::ast::builtins::SequenceMethodExprVisitor&>
              (*(Expression **)((long)ppEVar1 + lVar3),visitor);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        expr.visit(visitor);
        for (auto item : matchItems)
            item->visit(visitor);
    }